

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-decompile.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  Result RVar3;
  wabt *this;
  _Any_data *callback;
  ReadBinaryOptions *options_00;
  int iVar4;
  string_view filename;
  string_view filename_00;
  bool fail_on_custom_section_error;
  DecompileOptions decompile_options;
  ReadBinaryOptions options;
  string infile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  string outfile;
  Errors errors;
  string s;
  OptionParser parser;
  ValidateOptions options_1;
  char s_description [208];
  char local_58d;
  undefined1 local_58c;
  undefined1 local_58b [19];
  undefined1 local_578 [15];
  undefined1 auStack_569 [9];
  code *local_560;
  undefined1 local_558;
  undefined1 uStack_557;
  undefined1 local_556;
  undefined1 local_555;
  code *local_548;
  undefined8 local_540;
  undefined1 local_538 [16];
  void *local_528;
  long lStack_520;
  long local_518;
  char *local_508;
  size_t local_500;
  char local_4f8 [16];
  Errors local_4e8;
  _Any_data local_4c8;
  code *local_4b8;
  code *local_4b0;
  OptionParser local_4a8;
  Features local_418;
  undefined1 local_3f8 [112];
  undefined1 local_388 [288];
  __node_base_ptr *local_268;
  size_type local_260;
  __node_base local_258;
  size_type sStack_250;
  float local_248;
  size_t local_240;
  __node_base_ptr p_Stack_238;
  __node_base_ptr *local_230;
  size_type local_228;
  __node_base local_220;
  size_type sStack_218;
  float local_210;
  size_t local_208;
  __node_base_ptr p_Stack_200;
  __node_base_ptr *local_1f8;
  size_type local_1f0;
  __node_base local_1e8;
  size_type sStack_1e0;
  float local_1d8;
  size_t local_1d0;
  __node_base_ptr p_Stack_1c8;
  __node_base_ptr *local_1c0;
  size_type local_1b8;
  __node_base local_1b0;
  size_type sStack_1a8;
  float local_1a0;
  size_t local_198;
  __node_base_ptr p_Stack_190;
  __node_base_ptr *local_188;
  size_type local_180;
  __node_base local_178;
  size_type sStack_170;
  float local_168;
  size_t local_160;
  __node_base_ptr p_Stack_158;
  __node_base_ptr *local_150;
  size_type local_148;
  __node_base local_140;
  size_type sStack_138;
  float local_130;
  size_t local_128;
  __node_base_ptr p_Stack_120;
  __node_base_ptr *local_118;
  size_type local_110;
  __node_base local_108;
  size_type sStack_100;
  float local_f8;
  size_t local_f0;
  __node_base_ptr p_Stack_e8;
  __node_base_ptr *local_e0;
  size_type local_d8;
  __node_base local_d0;
  size_type sStack_c8;
  float local_c0;
  size_t local_b8;
  __node_base_ptr p_Stack_b0;
  __buckets_ptr local_a8;
  size_type local_a0;
  __node_base local_98;
  size_type sStack_90;
  float local_88;
  size_t local_80;
  undefined1 auStack_78 [24];
  _Rb_tree_node_base local_60;
  size_t local_40;
  
  wabt::InitStdio();
  local_548 = (code *)local_538;
  local_540 = 0;
  local_538[0] = (code)0x0;
  local_500 = 0;
  local_4f8[0] = '\0';
  local_58b[0] = false;
  local_58b[1] = true;
  local_58b[2] = true;
  local_58b[3] = true;
  local_58b[4] = true;
  local_58b[5] = false;
  local_58b[6] = false;
  local_58b[7] = true;
  local_58b[8] = false;
  local_58b[9] = true;
  local_58b[10] = true;
  local_58b[0xb] = false;
  local_58b[0xc] = false;
  local_58b[0xd] = false;
  local_58b[0xe] = false;
  local_58b._15_4_ = 0;
  local_58d = '\x01';
  local_508 = local_4f8;
  memcpy(local_3f8,
         "  Read a file in the WebAssembly binary format, and convert it to\n  a decompiled text file.\n\nexamples:\n  # parse binary file test.wasm and write text file test.dcmp\n  $ wasm-decompile test.wasm -o test.dcmp\n"
         ,0xd0);
  wabt::OptionParser::OptionParser(&local_4a8,"wasm-decompile",local_3f8);
  local_578._8_7_ = 0;
  local_578._0_8_ = &local_508;
  local_560 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:58:9)>
              ::_M_invoke;
  auStack_569[0] = '\0';
  auStack_569._1_3_ = 0x114488;
  auStack_569._4_5_ = 0;
  wabt::OptionParser::AddOption
            (&local_4a8,'o',"output","FILENAME",
             "Output file for the decompiled file, by default use stdout",(Callback *)local_578);
  if ((code *)CONCAT53(auStack_569._4_5_,auStack_569._1_3_) != (code *)0x0) {
    (*(code *)CONCAT53(auStack_569._4_5_,auStack_569._1_3_))(local_578,local_578,3);
  }
  wabt::Features::AddOptions((Features *)local_58b,&local_4a8);
  local_578._8_7_ = 0;
  local_578._0_8_ = &local_58d;
  local_560 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:65:22)>
              ::_M_invoke;
  auStack_569._0_4_ = 0x1144b600;
  auStack_569._4_5_ = 0;
  wabt::OptionParser::AddOption
            (&local_4a8,"ignore-custom-section-errors","Ignore errors in custom sections",
             (NullCallback *)local_578);
  if ((code *)CONCAT53(auStack_569._4_5_,auStack_569._1_3_) != (code *)0x0) {
    (*(code *)CONCAT53(auStack_569._4_5_,auStack_569._1_3_))(local_578,local_578,3);
  }
  local_578._0_8_ = auStack_569 + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"filename","");
  callback = &local_4c8;
  local_4c8._8_8_ = 0;
  local_4c8._M_unused._M_object = &local_548;
  local_4b0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:67:24)>
              ::_M_invoke;
  local_4b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:67:24)>
              ::_M_manager;
  wabt::OptionParser::AddArgument(&local_4a8,(string *)local_578,One,(Callback *)callback);
  if (local_4b8 != (code *)0x0) {
    (*local_4b8)(&local_4c8,&local_4c8,3);
  }
  if ((undefined1 *)local_578._0_8_ != auStack_569 + 1) {
    operator_delete((void *)local_578._0_8_,CONCAT53(auStack_569._4_5_,auStack_569._1_3_) + 1);
  }
  wabt::OptionParser::Parse(&local_4a8,argc,argv);
  if (local_4a8.on_error_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4a8.on_error_.super__Function_base._M_manager)
              ((_Any_data *)&local_4a8.on_error_,(_Any_data *)&local_4a8.on_error_,__destroy_functor
              );
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_4a8.arguments_);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            (&local_4a8.options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.description_._M_dataplus._M_p != &local_4a8.description_.field_2) {
    operator_delete(local_4a8.description_._M_dataplus._M_p,
                    local_4a8.description_.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_4a8.program_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.program_name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8.program_name_._M_dataplus._M_p,
                    CONCAT71(local_4a8.program_name_.field_2._M_allocated_capacity._1_7_,
                             local_4a8.program_name_.field_2._M_local_buf[0]) + 1);
  }
  pcVar2 = local_548;
  local_528 = (void *)0x0;
  lStack_520 = 0;
  local_518 = 0;
  this = (wabt *)strlen((char *)local_548);
  filename._M_str = (char *)&local_528;
  filename._M_len = (size_t)pcVar2;
  RVar3 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  iVar4 = 1;
  if (RVar3.enum_ == Ok) {
    local_4e8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4e8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4e8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f8._32_8_ = local_3f8 + 0x30;
    local_3f8._16_4_ = 0;
    local_3f8._20_8_ = 0;
    local_3f8._0_8_ = 0;
    local_3f8._8_4_ = 0;
    local_3f8._12_4_ = 0;
    local_3f8._40_8_ = 0;
    local_3f8[0x30] = '\0';
    local_3f8._64_8_ = (ModuleField *)0x0;
    local_3f8._72_8_ = (ModuleField *)0x0;
    local_3f8._80_8_ = 0;
    local_3f8._88_4_ = 0;
    local_3f8._92_4_ = 0;
    local_3f8._96_4_ = 0;
    local_3f8._100_8_ = (__node_base_ptr)0x0;
    memset(local_388,0,0x120);
    local_260 = 1;
    local_258._M_nxt = (_Hash_node_base *)0x0;
    sStack_250 = 0;
    local_248 = 1.0;
    local_240 = 0;
    p_Stack_238 = (__node_base_ptr)0x0;
    local_230 = &p_Stack_200;
    local_228 = 1;
    local_220._M_nxt = (_Hash_node_base *)0x0;
    sStack_218 = 0;
    local_210 = 1.0;
    local_208 = 0;
    p_Stack_200 = (__node_base_ptr)0x0;
    local_1f8 = &p_Stack_1c8;
    local_1f0 = 1;
    local_1e8._M_nxt = (_Hash_node_base *)0x0;
    sStack_1e0 = 0;
    local_1d8 = 1.0;
    local_1d0 = 0;
    p_Stack_1c8 = (__node_base_ptr)0x0;
    local_1c0 = &p_Stack_190;
    local_1b8 = 1;
    local_1b0._M_nxt = (_Hash_node_base *)0x0;
    sStack_1a8 = 0;
    local_1a0 = 1.0;
    local_198 = 0;
    p_Stack_190 = (__node_base_ptr)0x0;
    local_188 = &p_Stack_158;
    local_180 = 1;
    local_178._M_nxt = (_Hash_node_base *)0x0;
    sStack_170 = 0;
    local_168 = 1.0;
    local_160 = 0;
    p_Stack_158 = (__node_base_ptr)0x0;
    local_150 = &p_Stack_120;
    local_148 = 1;
    local_140._M_nxt = (_Hash_node_base *)0x0;
    sStack_138 = 0;
    local_130 = 1.0;
    local_128 = 0;
    p_Stack_120 = (__node_base_ptr)0x0;
    local_118 = &p_Stack_e8;
    local_110 = 1;
    local_108._M_nxt = (_Hash_node_base *)0x0;
    sStack_100 = 0;
    local_f8 = 1.0;
    local_f0 = 0;
    p_Stack_e8 = (__node_base_ptr)0x0;
    local_e0 = &p_Stack_b0;
    local_d8 = 1;
    local_d0._M_nxt = (_Hash_node_base *)0x0;
    sStack_c8 = 0;
    local_c0 = 1.0;
    local_b8 = 0;
    p_Stack_b0 = (__node_base_ptr)0x0;
    local_a8 = (__buckets_ptr)auStack_78;
    local_a0 = 1;
    local_98._M_nxt = (_Hash_node_base *)0x0;
    sStack_90 = 0;
    local_88 = 1.0;
    local_60._M_left = &local_60;
    local_60._M_color = _S_red;
    local_60._M_parent = (_Base_ptr)0x0;
    local_80 = 0;
    auStack_78._0_7_ = 0;
    auStack_78._7_4_ = 0;
    local_40 = 0;
    local_578._0_8_ = CONCAT71(local_58b._1_7_,local_58b[0]);
    local_578._8_7_ = CONCAT43(local_58b._11_4_,CONCAT21(local_58b._9_2_,local_58b[8]));
    options_00 = (ReadBinaryOptions *)local_578;
    auStack_569._0_4_ = local_58b._15_4_;
    local_560 = (_Invoker_type)0x0;
    local_558 = true;
    uStack_557 = true;
    local_556 = local_58d;
    local_555 = false;
    local_268 = &p_Stack_238;
    local_60._M_right = local_60._M_left;
    RVar3 = wabt::ReadBinaryIr((char *)local_548,local_528,lStack_520 - (long)local_528,options_00,
                               &local_4e8,(Module *)local_3f8);
    iVar4 = 1;
    if (RVar3.enum_ == Ok) {
      local_418._1_7_ = local_58b._1_7_;
      local_418.exceptions_enabled_ = local_58b[0];
      local_418._9_2_ = local_58b._9_2_;
      local_418.tail_call_enabled_ = local_58b[8];
      local_418._11_4_ = local_58b._11_4_;
      local_418.multi_memory_enabled_ = (bool)local_58b[0xf];
      local_418.extended_const_enabled_ = (bool)local_58b[0x10];
      local_418.relaxed_simd_enabled_ = (bool)local_58b[0x11];
      local_418.custom_page_sizes_enabled_ = (bool)local_58b[0x12];
      RVar3 = wabt::ValidateModule((Module *)local_3f8,&local_4e8,(ValidateOptions *)&local_418);
      iVar4 = 1;
      if (RVar3.enum_ == Ok) {
        RVar3 = wabt::GenerateNames((Module *)local_3f8,AlphaNames);
        iVar4 = 1;
        if (RVar3.enum_ == Ok) {
          wabt::RenameAll((Module *)local_3f8);
          wabt::ApplyNames((Module *)local_3f8);
          wabt::Decompile_abi_cxx11_
                    ((string *)&local_4c8,(wabt *)local_3f8,(Module *)&local_58c,
                     (DecompileOptions *)options_00);
          if (local_500 == 0) {
            wabt::FileStream::FileStream((FileStream *)&local_4a8,_stdout,(Stream *)0x0);
          }
          else {
            filename_00._M_str = local_508;
            filename_00._M_len = local_500;
            wabt::FileStream::FileStream((FileStream *)&local_4a8,filename_00,(Stream *)0x0);
          }
          wabt::Stream::WriteData
                    ((Stream *)&local_4a8,local_4c8._M_unused._M_object,local_4c8._8_8_,(char *)0x0,
                     No);
          wabt::FileStream::~FileStream((FileStream *)&local_4a8);
          iVar4 = 0;
          if ((code **)local_4c8._M_unused._0_8_ != &local_4b8) {
            operator_delete(local_4c8._M_unused._M_object,(ulong)(local_4b8 + 1));
            iVar4 = 0;
          }
        }
      }
    }
    local_4a8.program_name_._M_string_length = 0;
    local_4a8.program_name_.field_2._M_local_buf[0] = '\0';
    local_4a8.program_name_._M_dataplus._M_p = (pointer)paVar1;
    wabt::FormatErrorsToFile
              (&local_4e8,Binary,(LexerSourceLineFinder *)0x0,_stderr,&local_4a8.program_name_,Never
               ,0x50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8.program_name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a8.program_name_._M_dataplus._M_p,
                      CONCAT71(local_4a8.program_name_.field_2._M_allocated_capacity._1_7_,
                               local_4a8.program_name_.field_2._M_local_buf[0]) + 1);
    }
    wabt::Module::~Module((Module *)local_3f8);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_4e8);
  }
  if (local_528 != (void *)0x0) {
    operator_delete(local_528,local_518 - (long)local_528);
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508,CONCAT71(local_4f8._1_7_,local_4f8[0]) + 1);
  }
  if (local_548 != (code *)local_538) {
    operator_delete(local_548,CONCAT71(local_538._1_7_,local_538[0]) + 1);
  }
  return iVar4;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  std::string infile;
  std::string outfile;
  Features features;
  DecompileOptions decompile_options;
  bool fail_on_custom_section_error = true;

  {
    const char s_description[] =
        "  Read a file in the WebAssembly binary format, and convert it to\n"
        "  a decompiled text file.\n"
        "\n"
        "examples:\n"
        "  # parse binary file test.wasm and write text file test.dcmp\n"
        "  $ wasm-decompile test.wasm -o test.dcmp\n";
    OptionParser parser("wasm-decompile", s_description);
    parser.AddOption(
        'o', "output", "FILENAME",
        "Output file for the decompiled file, by default use stdout",
        [&](const char* argument) {
          outfile = argument;
          ConvertBackslashToSlash(&outfile);
        });
    features.AddOptions(&parser);
    parser.AddOption("ignore-custom-section-errors",
                     "Ignore errors in custom sections",
                     [&]() { fail_on_custom_section_error = false; });
    parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                       [&](const char* argument) {
                         infile = argument;
                         ConvertBackslashToSlash(&infile);
                       });
    parser.Parse(argc, argv);
  }

  std::vector<uint8_t> file_data;
  Result result = ReadFile(infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(features, nullptr, true, kStopOnFirstError,
                              fail_on_custom_section_error);
    result = ReadBinaryIr(infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      ValidateOptions options(features);
      result = ValidateModule(&module, &errors, options);
      if (Succeeded(result)) {
        result =
            GenerateNames(&module, static_cast<NameOpts>(NameOpts::AlphaNames));
      }
      if (Succeeded(result)) {
        // Must be called after ReadBinaryIr & GenerateNames, and before
        // ApplyNames, see comments at definition.
        RenameAll(module);
      }
      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }
      if (Succeeded(result)) {
        auto s = Decompile(module, decompile_options);
        FileStream stream(!outfile.empty() ? FileStream(outfile)
                                           : FileStream(stdout));
        stream.WriteData(s.data(), s.size());
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}